

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O0

Result_Type
chaiscript::detail::
Cast_Helper_Inner<std::shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  bool bVar1;
  Type_Info *this;
  shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *in_RDI;
  shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function> sVar3;
  Result_Type RVar4;
  element_type *this_00;
  
  this_00 = in_RDI;
  this = Boxed_Value::get_type_info((Boxed_Value *)0x3b8289);
  bVar1 = Type_Info::is_const(this);
  if (bVar1) {
    Boxed_Value::get((Boxed_Value *)0x3b82bf);
    Any::cast<std::shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function_const>>
              ((Any *)this_00);
    std::shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function>::shared_ptr
              ((shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function> *)this_00,
               (shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function> *)in_RDI);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    Boxed_Value::get((Boxed_Value *)0x3b829f);
    Any::cast<std::shared_ptr<chaiscript::dispatch::Assignable_Proxy_Function>>((Any *)this_00);
    sVar3 = std::
            const_pointer_cast<chaiscript::dispatch::Assignable_Proxy_Function_const,chaiscript::dispatch::Assignable_Proxy_Function>
                      (in_RDX);
    _Var2 = sVar3.
            super___shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  }
  RVar4.
  super___shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  RVar4.
  super___shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = this_00;
  return (Result_Type)
         RVar4.
         super___shared_ptr<const_chaiscript::dispatch::Assignable_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (!ob.get_type_info().is_const())
          {
            return std::const_pointer_cast<const Result>(ob.get().cast<std::shared_ptr<Result> >());
          } else {
            return ob.get().cast<std::shared_ptr<const Result> >();
          }
        }